

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3PutVarint(uchar *p,u64 v)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  byte bVar7;
  byte abStack_a [10];
  
  bVar7 = (byte)v;
  if (v < 0x80) {
    *p = bVar7;
    iVar2 = 1;
  }
  else {
    if (0x3fff < v) {
      if (v >> 0x38 == 0) {
        uVar3 = 0;
        do {
          uVar5 = uVar3;
          abStack_a[uVar5] = (byte)v | 0x80;
          uVar3 = uVar5 + 1;
          bVar1 = 0x7f < v;
          v = v >> 7;
        } while (bVar1);
        abStack_a[0] = abStack_a[0] & 0x7f;
        uVar6 = uVar3;
        for (; uVar5 != 0xffffffffffffffff; uVar5 = uVar5 - 1) {
          uVar6 = uVar6 - 1;
          *p = abStack_a[uVar6 & 0xffffffff];
          p = p + 1;
        }
      }
      else {
        p[8] = bVar7;
        uVar5 = v >> 8;
        uVar3 = 9;
        for (uVar4 = 7; -1 < (int)uVar4; uVar4 = uVar4 - 1) {
          p[uVar4] = (byte)uVar5 | 0x80;
          uVar5 = uVar5 >> 7;
        }
      }
      return (int)uVar3;
    }
    *p = (byte)(v >> 7) | 0x80;
    p[1] = bVar7 & 0x7f;
    iVar2 = 2;
  }
  return iVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3PutVarint(unsigned char *p, u64 v){
  if( v<=0x7f ){
    p[0] = v&0x7f;
    return 1;
  }
  if( v<=0x3fff ){
    p[0] = ((v>>7)&0x7f)|0x80;
    p[1] = v&0x7f;
    return 2;
  }
  return putVarint64(p,v);
}